

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

RPCHelpMan * getnettotals(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  RPCHelpMan *in_RDI;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff418;
  undefined8 in_stack_fffffffffffff428;
  undefined8 in_stack_fffffffffffff430;
  undefined8 in_stack_fffffffffffff438;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff448;
  pointer in_stack_fffffffffffff458;
  pointer pRVar8;
  pointer in_stack_fffffffffffff460;
  pointer pRVar9;
  pointer in_stack_fffffffffffff468;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff470;
  pointer pRVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff490;
  pointer pRVar14;
  pointer pRVar15;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_af0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a78;
  RPCResults local_a60;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a48;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  ulong *local_970;
  undefined8 local_968;
  ulong local_960;
  undefined8 uStack_958;
  ulong *local_950;
  size_type local_948;
  ulong local_940;
  undefined8 uStack_938;
  long *local_930 [2];
  long local_920 [2];
  long *local_910 [2];
  long local_900 [2];
  long *local_8f0 [2];
  long local_8e0 [2];
  long *local_8d0 [2];
  long local_8c0 [2];
  long *local_8b0 [2];
  long local_8a0 [2];
  long *local_890 [2];
  long local_880 [2];
  long *local_870 [2];
  long local_860 [2];
  long *local_850 [2];
  long local_840 [2];
  long *local_830 [2];
  long local_820 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_810;
  long *local_7f0 [2];
  long local_7e0 [2];
  pointer local_7d0 [2];
  undefined1 local_7c0 [152];
  RPCResult local_728;
  RPCResult local_6a0;
  RPCResult local_618;
  RPCResult local_590;
  RPCResult local_508;
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  size_type *local_420;
  size_type local_418;
  size_type local_410;
  undefined8 uStack_408;
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_3c0;
  long *local_3a0 [2];
  long local_390 [2];
  pointer local_380 [2];
  undefined1 local_370 [152];
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getnettotals","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Returns information about network traffic, including bytes in, bytes out,\nand current system time."
             ,"");
  local_120[0] = local_110;
  local_a48.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a48.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a48.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_380[0] = (pointer)local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"totalbytesrecv","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Total bytes received","");
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff430;
  description._M_string_length = in_stack_fffffffffffff440;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description.field_2 = in_stack_fffffffffffff448;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff460;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff458;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult
            ((RPCResult *)(local_370 + 0x10),NUM,m_key_name,description,inner,SUB81(local_380,0));
  local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"totalbytessent","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"Total bytes sent","");
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff430;
  description_00._M_string_length = in_stack_fffffffffffff440;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_00.field_2 = in_stack_fffffffffffff448;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_2d8,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_3c0,0));
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"timemillis","");
  std::operator+(&local_440,"Current system ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_440," in milliseconds");
  local_420 = &local_410;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_410 = paVar4->_M_allocated_capacity;
    uStack_408 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_410 = paVar4->_M_allocated_capacity;
    local_420 = psVar1;
  }
  local_418 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff430;
  description_01._M_string_length = in_stack_fffffffffffff440;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_01.field_2 = in_stack_fffffffffffff448;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_250,NUM_TIME,m_key_name_01,description_01,inner_01,false);
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"uploadtarget","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"");
  local_7d0[0] = (pointer)local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"timeframe","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f0,"Length of the measuring timeframe in seconds","");
  local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff430;
  description_02._M_string_length = in_stack_fffffffffffff440;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_02.field_2 = in_stack_fffffffffffff448;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult
            ((RPCResult *)(local_7c0 + 0x10),NUM,m_key_name_02,description_02,inner_02,
             SUB81(local_7d0,0));
  local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"target","");
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"Target in bytes","");
  local_b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff430;
  description_03._M_string_length = in_stack_fffffffffffff440;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_03.field_2 = in_stack_fffffffffffff448;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_728,NUM,m_key_name_03,description_03,inner_03,SUB81(&local_810,0));
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"target_reached","");
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_870,"True if target is reached","");
  local_b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff430;
  description_04._M_string_length = in_stack_fffffffffffff440;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_04.field_2 = in_stack_fffffffffffff448;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_6a0,BOOL,m_key_name_04,description_04,inner_04,SUB81(local_850,0));
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"serve_historical_blocks","");
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b0,"True if serving historical blocks","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff430;
  description_05._M_string_length = in_stack_fffffffffffff440;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_05.field_2 = in_stack_fffffffffffff448;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_618,BOOL,m_key_name_05,description_05,inner_05,SUB81(local_890,0));
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"bytes_left_in_cycle","");
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f0,"Bytes left in current time cycle","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff430;
  description_06._M_string_length = in_stack_fffffffffffff440;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_06.field_2 = in_stack_fffffffffffff448;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff460;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff458;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff468;
  RPCResult::RPCResult(&local_590,NUM,m_key_name_06,description_06,inner_06,SUB81(local_8d0,0));
  local_910[0] = local_900;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"time_left_in_cycle","");
  local_930[0] = local_920;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_930,"Seconds left in current time cycle","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff430;
  description_07._M_string_length = in_stack_fffffffffffff440;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff448._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_508,NUM,m_key_name_07,description_07,inner_07,SUB81(local_910,0));
  __l._M_len = 6;
  __l._M_array = (iterator)(local_7c0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_af0,__l,(allocator_type *)&stack0xfffffffffffff457);
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff430;
  description_08._M_string_length = in_stack_fffffffffffff440;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff448._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_1c8,OBJ,m_key_name_08,description_08,inner_08,SUB81(local_460,0));
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)(local_370 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a78,__l_00,(allocator_type *)&stack0xfffffffffffff456);
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  m_key_name_09.field_2._8_8_ = in_stack_fffffffffffff430;
  description_09._M_string_length = in_stack_fffffffffffff440;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff438;
  description_09.field_2 = in_stack_fffffffffffff448;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_09,description_09,inner_09,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff418;
  result.m_key_name._M_string_length = in_stack_fffffffffffff428;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff430;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff438;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff440;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff448;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff470;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff490;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_a60,result);
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"getnettotals","");
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"");
  HelpExampleCli(&local_990,&local_9b0,&local_9d0);
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"getnettotals","");
  local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"");
  HelpExampleRpc(&local_9f0,&local_a10,&local_a30);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    uVar5 = local_990.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_9f0._M_string_length + local_990._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
      uVar5 = local_9f0.field_2._M_allocated_capacity;
    }
    if (local_9f0._M_string_length + local_990._M_string_length <= (ulong)uVar5) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_9f0,0,0,local_990._M_dataplus._M_p,local_990._M_string_length);
      goto LAB_00344e04;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_990,local_9f0._M_dataplus._M_p,local_9f0._M_string_length);
LAB_00344e04:
  local_970 = &local_960;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar4) {
    local_960 = paVar4->_M_allocated_capacity;
    uStack_958 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_960 = paVar4->_M_allocated_capacity;
    local_970 = puVar2;
  }
  local_948 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if (local_970 == &local_960) {
    uStack_938 = uStack_958;
    local_950 = &local_940;
  }
  else {
    local_950 = local_970;
  }
  local_940 = local_960;
  local_968 = 0;
  local_960 = local_960 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:576:9)>
           ::_M_manager;
  description_10._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:576:9)>
       ::_M_invoke;
  description_10._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:576:9)>
                ::_M_manager;
  description_10.field_2 = in_stack_fffffffffffff448;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff470;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = in_stack_fffffffffffff490;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_970 = &local_960;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff428)),description_10,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff428,&stack0xfffffffffffff428,3);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950,local_940 + 1);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970,local_960 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a60.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a78);
  lVar6 = 0x220;
  do {
    if ((long *)(local_370 + lVar6) != *(long **)((long)local_380 + lVar6)) {
      operator_delete(*(long **)((long)local_380 + lVar6),*(long *)(local_370 + lVar6) + 1);
    }
    if ((long *)((long)local_390 + lVar6) != *(long **)((long)local_3a0 + lVar6)) {
      operator_delete(*(long **)((long)local_3a0 + lVar6),*(long *)((long)local_390 + lVar6) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar6));
    if ((long *)((long)local_3d0 + lVar6) != *(long **)((long)local_3e0 + lVar6)) {
      operator_delete(*(long **)((long)local_3e0 + lVar6),*(long *)((long)local_3d0 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_af0);
  lVar6 = 0x330;
  do {
    if ((long *)(local_7c0 + lVar6) != *(long **)((long)local_7d0 + lVar6)) {
      operator_delete(*(long **)((long)local_7d0 + lVar6),*(long *)(local_7c0 + lVar6) + 1);
    }
    if ((long *)((long)local_7e0 + lVar6) != *(long **)((long)local_7f0 + lVar6)) {
      operator_delete(*(long **)((long)local_7f0 + lVar6),*(long *)((long)local_7e0 + lVar6) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar6));
    if ((long *)((long)local_820 + lVar6) != *(long **)((long)local_830 + lVar6)) {
      operator_delete(*(long **)((long)local_830 + lVar6),*(long *)((long)local_820 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff458);
  if (local_930[0] != local_920) {
    operator_delete(local_930[0],local_920[0] + 1);
  }
  if (local_910[0] != local_900) {
    operator_delete(local_910[0],local_900[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff478);
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff498);
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  if (local_890[0] != local_880) {
    operator_delete(local_890[0],local_880[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b48);
  if (local_870[0] != local_860) {
    operator_delete(local_870[0],local_860[0] + 1);
  }
  if (local_850[0] != local_840) {
    operator_delete(local_850[0],local_840[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b28);
  if (local_830[0] != local_820) {
    operator_delete(local_830[0],local_820[0] + 1);
  }
  if (local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_810.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_810.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b08);
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != (pointer)local_7c0) {
    operator_delete(local_7d0[0],local_7c0._0_8_ + 1);
  }
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ad8);
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ab8);
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_3c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_3c0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a98);
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_380[0] != (pointer)local_370) {
    operator_delete(local_380[0],local_370._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a48);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnettotals()
{
    return RPCHelpMan{"getnettotals",
        "Returns information about network traffic, including bytes in, bytes out,\n"
        "and current system time.",
        {},
                RPCResult{
                   RPCResult::Type::OBJ, "", "",
                   {
                       {RPCResult::Type::NUM, "totalbytesrecv", "Total bytes received"},
                       {RPCResult::Type::NUM, "totalbytessent", "Total bytes sent"},
                       {RPCResult::Type::NUM_TIME, "timemillis", "Current system " + UNIX_EPOCH_TIME + " in milliseconds"},
                       {RPCResult::Type::OBJ, "uploadtarget", "",
                       {
                           {RPCResult::Type::NUM, "timeframe", "Length of the measuring timeframe in seconds"},
                           {RPCResult::Type::NUM, "target", "Target in bytes"},
                           {RPCResult::Type::BOOL, "target_reached", "True if target is reached"},
                           {RPCResult::Type::BOOL, "serve_historical_blocks", "True if serving historical blocks"},
                           {RPCResult::Type::NUM, "bytes_left_in_cycle", "Bytes left in current time cycle"},
                           {RPCResult::Type::NUM, "time_left_in_cycle", "Seconds left in current time cycle"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getnettotals", "")
            + HelpExampleRpc("getnettotals", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("totalbytesrecv", connman.GetTotalBytesRecv());
    obj.pushKV("totalbytessent", connman.GetTotalBytesSent());
    obj.pushKV("timemillis", TicksSinceEpoch<std::chrono::milliseconds>(SystemClock::now()));

    UniValue outboundLimit(UniValue::VOBJ);
    outboundLimit.pushKV("timeframe", count_seconds(connman.GetMaxOutboundTimeframe()));
    outboundLimit.pushKV("target", connman.GetMaxOutboundTarget());
    outboundLimit.pushKV("target_reached", connman.OutboundTargetReached(false));
    outboundLimit.pushKV("serve_historical_blocks", !connman.OutboundTargetReached(true));
    outboundLimit.pushKV("bytes_left_in_cycle", connman.GetOutboundTargetBytesLeft());
    outboundLimit.pushKV("time_left_in_cycle", count_seconds(connman.GetMaxOutboundTimeLeftInCycle()));
    obj.pushKV("uploadtarget", std::move(outboundLimit));
    return obj;
},
    };
}